

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O0

ring_buffer_size_t
PaUtil_GetRingBufferReadRegions
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementCount,void **dataPtr1,
          ring_buffer_size_t *sizePtr1,void **dataPtr2,ring_buffer_size_t *sizePtr2)

{
  ring_buffer_size_t rVar1;
  ulong uVar2;
  long lVar3;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  PaUtilRingBuffer *in_RDI;
  undefined8 *in_R8;
  long *in_R9;
  ring_buffer_size_t firstHalf;
  ring_buffer_size_t available;
  ring_buffer_size_t index;
  long local_10;
  
  rVar1 = PaUtil_GetRingBufferReadAvailable(in_RDI);
  local_10 = in_RSI;
  if (rVar1 < in_RSI) {
    local_10 = rVar1;
  }
  uVar2 = in_RDI->readIndex & in_RDI->smallMask;
  if (in_RDI->bufferSize < (long)(uVar2 + local_10)) {
    lVar3 = in_RDI->bufferSize - uVar2;
    *in_RDX = (long)(in_RDI->buffer + uVar2 * in_RDI->elementSizeBytes);
    *in_RCX = lVar3;
    *in_R8 = in_RDI->buffer;
    *in_R9 = local_10 - lVar3;
  }
  else {
    *in_RDX = (long)(in_RDI->buffer + uVar2 * in_RDI->elementSizeBytes);
    *in_RCX = local_10;
    *in_R8 = 0;
    *in_R9 = 0;
  }
  return local_10;
}

Assistant:

ring_buffer_size_t PaUtil_GetRingBufferReadRegions( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementCount,
                                void **dataPtr1, ring_buffer_size_t *sizePtr1,
                                void **dataPtr2, ring_buffer_size_t *sizePtr2 )
{
    ring_buffer_size_t   index;
    ring_buffer_size_t   available = PaUtil_GetRingBufferReadAvailable( rbuf ); /* doesn't use memory barrier */
    if( elementCount > available ) elementCount = available;
    /* Check to see if read is not contiguous. */
    index = rbuf->readIndex & rbuf->smallMask;
    if( (index + elementCount) > rbuf->bufferSize )
    {
        /* Write data in two blocks that wrap the buffer. */
        ring_buffer_size_t firstHalf = rbuf->bufferSize - index;
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = firstHalf;
        *dataPtr2 = &rbuf->buffer[0];
        *sizePtr2 = elementCount - firstHalf;
    }
    else
    {
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = elementCount;
        *dataPtr2 = NULL;
        *sizePtr2 = 0;
    }
    
    if( available )
        PaUtil_ReadMemoryBarrier(); /* (read-after-read) => read barrier */

    return elementCount;
}